

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O3

int myutils::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                   timeval *__timeout)

{
  int iVar1;
  timeval tv;
  timeval local_10;
  
  if (__readfds != (fd_set *)0x0) {
    __readfds->fds_bits[0xe] = 0;
    __readfds->fds_bits[0xf] = 0;
    __readfds->fds_bits[0xc] = 0;
    __readfds->fds_bits[0xd] = 0;
    __readfds->fds_bits[10] = 0;
    __readfds->fds_bits[0xb] = 0;
    __readfds->fds_bits[8] = 0;
    __readfds->fds_bits[9] = 0;
    __readfds->fds_bits[6] = 0;
    __readfds->fds_bits[7] = 0;
    __readfds->fds_bits[4] = 0;
    __readfds->fds_bits[5] = 0;
    __readfds->fds_bits[2] = 0;
    __readfds->fds_bits[3] = 0;
    __readfds->fds_bits[0] = 0;
    __readfds->fds_bits[1] = 0;
  }
  if (__writefds != (fd_set *)0x0) {
    __writefds->fds_bits[0xe] = 0;
    __writefds->fds_bits[0xf] = 0;
    __writefds->fds_bits[0xc] = 0;
    __writefds->fds_bits[0xd] = 0;
    __writefds->fds_bits[10] = 0;
    __writefds->fds_bits[0xb] = 0;
    __writefds->fds_bits[8] = 0;
    __writefds->fds_bits[9] = 0;
    __writefds->fds_bits[6] = 0;
    __writefds->fds_bits[7] = 0;
    __writefds->fds_bits[4] = 0;
    __writefds->fds_bits[5] = 0;
    __writefds->fds_bits[2] = 0;
    __writefds->fds_bits[3] = 0;
    __writefds->fds_bits[0] = 0;
    __writefds->fds_bits[1] = 0;
  }
  if (__readfds != (fd_set *)0x0) {
    iVar1 = __nfds + 0x3f;
    if (-1 < __nfds) {
      iVar1 = __nfds;
    }
    __readfds->fds_bits[iVar1 >> 6] =
         __readfds->fds_bits[iVar1 >> 6] | 1L << ((byte)(__nfds % 0x40) & 0x3f);
  }
  if (__writefds != (fd_set *)0x0) {
    iVar1 = __nfds + 0x3f;
    if (-1 < __nfds) {
      iVar1 = __nfds;
    }
    __writefds->fds_bits[iVar1 >> 6] =
         __writefds->fds_bits[iVar1 >> 6] | 1L << ((byte)__nfds & 0x3f);
  }
  local_10.tv_sec = 0;
  local_10.tv_usec = 500000;
  iVar1 = ::select(__nfds + 1,__readfds,__writefds,(fd_set *)0x0,&local_10);
  return iVar1;
}

Assistant:

int select(SOCKET socket, fd_set* rset, fd_set* wset)
    {
        if (rset) FD_ZERO(rset);
        if (wset) FD_ZERO(wset);

        if (rset) FD_SET(socket, rset);
        if (wset) FD_SET(socket, wset);

        struct timeval tv;
        tv.tv_sec = 0;
        tv.tv_usec = 500 * 1000;

        int high_sock = (int)socket;
        return ::select(high_sock + 1, rset, wset, NULL, &tv);
    }